

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeSSBOBlockTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::logProgramInfo
               (NegativeTestContext *ctx,GLint program)

{
  undefined4 bufSize;
  undefined4 program_00;
  MessageBuilder *pMVar1;
  size_type __n;
  reference pvVar2;
  ulong uVar3;
  bool bVar4;
  MessageBuilder local_520;
  allocator local_399;
  undefined1 local_398 [8];
  string programLogMessage;
  undefined1 local_370 [8];
  vector<char,_std::allocator<char>_> infoLog;
  MessageBuilder local_350;
  MessageBuilder local_1d0;
  TestLog *local_40;
  TestLog *log;
  string message;
  GLint maxLength;
  GLint program_local;
  NegativeTestContext *ctx_local;
  
  message.field_2._8_4_ = 0;
  message.field_2._12_4_ = program;
  std::__cxx11::string::string((string *)&log);
  local_40 = glu::CallLogWrapper::getLog(&ctx->super_CallLogWrapper);
  glu::CallLogWrapper::glGetProgramiv
            (&ctx->super_CallLogWrapper,message.field_2._12_4_,0x8b84,
             (GLint *)(message.field_2._M_local_buf + 8));
  std::__cxx11::string::operator=((string *)&log,"Program log:");
  tcu::TestLog::operator<<(&local_1d0,local_40,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<
                     (&local_1d0,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&log);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1d0);
  bVar4 = message.field_2._8_4_ != 0;
  if (bVar4) {
    __n = (size_type)(int)message.field_2._8_4_;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_370,__n,
               (allocator_type *)(programLogMessage.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator
              ((allocator<char> *)(programLogMessage.field_2._M_local_buf + 0xf));
    program_00 = message.field_2._12_4_;
    bufSize = message.field_2._8_4_;
    pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_370,0);
    glu::CallLogWrapper::glGetProgramInfoLog
              (&ctx->super_CallLogWrapper,program_00,bufSize,
               (GLsizei *)(message.field_2._M_local_buf + 8),pvVar2);
    pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_370,0);
    uVar3 = (ulong)(int)message.field_2._8_4_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_398,pvVar2,uVar3,&local_399);
    std::allocator<char>::~allocator((allocator<char> *)&local_399);
    tcu::TestLog::operator<<(&local_520,local_40,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<
                       (&local_520,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_398);
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_520);
    std::__cxx11::string::~string((string *)local_398);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_370);
  }
  else {
    std::__cxx11::string::operator=((string *)&log,"No available info log.");
    tcu::TestLog::operator<<(&local_350,local_40,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<
                       (&local_350,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&log);
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_350);
  }
  infoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl._21_3_ = 0;
  infoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_1_ = !bVar4;
  std::__cxx11::string::~string((string *)&log);
  return;
}

Assistant:

void logProgramInfo(NegativeTestContext& ctx, GLint program)
{
	GLint			maxLength	=	0;
	std::string		message;
	tcu::TestLog&	log			=	ctx.getLog();

	ctx.glGetProgramiv(program, GL_INFO_LOG_LENGTH, &maxLength);

	message = "Program log:";
	log << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;

	if (maxLength == 0)
	{
		message = "No available info log.";
		log << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;
		return;
	}

	std::vector<GLchar> infoLog(maxLength);
	ctx.glGetProgramInfoLog(program, maxLength, &maxLength, &infoLog[0]);

	std::string programLogMessage(&infoLog[0], maxLength);
	log << tcu::TestLog::Message << programLogMessage << tcu::TestLog::EndMessage;
}